

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.h
# Opt level: O0

AncillaryTextHeader * lrit::getHeader<lrit::AncillaryTextHeader>(Buffer *b,HeaderMap *m)

{
  bool bVar1;
  const_iterator cVar2;
  runtime_error *this;
  Buffer *in_RDX;
  AncillaryTextHeader *in_RDI;
  const_iterator it;
  int *in_stack_00000110;
  char (*in_stack_00000118) [2];
  char (*in_stack_00000120) [89];
  char (*in_stack_00000128) [37];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff78;
  string local_48 [32];
  _Self local_28;
  int pos;
  
  cVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                    (in_stack_ffffffffffffff78,(key_type *)0x29b0c7);
  pos = (int)((ulong)cVar2._M_node >> 0x20);
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 (in_stack_ffffffffffffff78);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x29b1ba);
    getHeader<lrit::AncillaryTextHeader>(in_RDX,pos);
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  util::str<char[37],char[89],char[2],int>
            (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110);
  std::runtime_error::runtime_error(this,local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

H getHeader(const Buffer& b, const HeaderMap& m) {
  auto it = m.find(H::CODE);
  ASSERT(it != m.end());
  return getHeader<H>(b, it->second);
}